

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32Arr
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  ostream *poVar5;
  long *plVar6;
  Instruction *inst_00;
  size_type *psVar7;
  uint32_t underlying_type;
  ostringstream ss;
  undefined1 local_1cc [12];
  long local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  inst_00 = (Instruction *)local_1cc;
  local_1cc._0_4_ = 0;
  sVar2 = GetUnderlyingType(this->_,(Decoration *)(ulong)(uint)decoration->struct_member_index_,inst
                            ,(uint32_t *)inst_00);
  if (sVar2 != SPV_SUCCESS) {
    return sVar2;
  }
  pIVar4 = ValidationState_t::FindDef(this->_,local_1cc._0_4_);
  if ((pIVar4->inst_).opcode == 0x1c) {
    uVar3 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    bVar1 = ValidationState_t::IsIntScalarType(this->_,uVar3);
    if (bVar1) {
      uVar3 = ValidationState_t::GetBitWidth(this->_,uVar3);
      if (uVar3 == 0x20) {
        return SPV_SUCCESS;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1cc._4_8_,local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," has components with bit width ",0x1f);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1cc._4_8_ != &local_1b8) {
        operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      if ((diag->super__Function_base)._M_manager != (_Manager_type)0x0) {
        sVar2 = (*diag->_M_invoker)((_Any_data *)diag,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_1cc + 4));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1cc._4_8_ != &local_1b8) {
          operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return sVar2;
      }
      goto LAB_0063e89e;
    }
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
  }
  plVar6 = (long *)std::__cxx11::string::append(local_1cc + 4);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0].field_2._8_4_ = *(undefined4 *)(plVar6 + 3);
    local_1a8[0].field_2._12_4_ = *(uint32_t *)((long)plVar6 + 0x1c);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1a8[0]._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((diag->super__Function_base)._M_manager != (_Manager_type)0x0) {
    sVar2 = (*diag->_M_invoker)((_Any_data *)diag,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1cc._4_8_ != &local_1b8) {
      operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
    }
    return sVar2;
  }
LAB_0063e89e:
  std::__throw_bad_function_call();
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32Arr(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsIntScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not int scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}